

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeImportTableGet(TranslateToFuzzReader *this)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  bool bVar1;
  Call *pCVar2;
  HeapType local_88;
  Type local_80 [3];
  allocator<wasm::Expression_*> local_61;
  Type local_60;
  Expression *local_58;
  iterator local_50;
  size_type local_48;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_40;
  size_t local_28;
  char *pcStack_20;
  TranslateToFuzzReader *local_10;
  TranslateToFuzzReader *this_local;
  
  local_10 = this;
  bVar1 = IString::operator_cast_to_bool(&(this->tableGetImportName).super_IString);
  if (!bVar1) {
    __assert_fail("tableGetImportName",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4e2,"Expression *wasm::TranslateToFuzzReader::makeImportTableGet()");
  }
  local_28 = (this->tableGetImportName).super_IString.str._M_len;
  pcStack_20 = (this->tableGetImportName).super_IString.str._M_str;
  Type::Type(&local_60,i32);
  local_58 = make(this,local_60);
  local_50 = &local_58;
  local_48 = 1;
  std::allocator<wasm::Expression_*>::allocator(&local_61);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_40,__l,&local_61);
  HeapType::HeapType(&local_88,func);
  Type::Type(local_80,local_88,Nullable,Inexact);
  target.super_IString.str._M_str = pcStack_20;
  target.super_IString.str._M_len = local_28;
  pCVar2 = Builder::makeCall(&this->builder,target,&local_40,local_80[0],false);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_40);
  std::allocator<wasm::Expression_*>::~allocator(&local_61);
  return (Expression *)pCVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeImportTableGet() {
  assert(tableGetImportName);
  return builder.makeCall(
    tableGetImportName, {make(Type::i32)}, Type(HeapType::func, Nullable));
}